

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdef.c
# Opt level: O3

void mdef_sseq2sen_active(mdef_t *mdef,uint8 *sseq,uint8 *sen)

{
  s3senid_t *psVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = mdef->n_sseq;
  if (0 < iVar3) {
    lVar2 = 0;
    do {
      if ((sseq[lVar2] != '\0') && (0 < mdef->n_emit_state)) {
        psVar1 = mdef->sseq[lVar2];
        lVar4 = 0;
        do {
          sen[psVar1[lVar4]] = '\x01';
          lVar4 = lVar4 + 1;
        } while (lVar4 < mdef->n_emit_state);
        iVar3 = mdef->n_sseq;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < iVar3);
  }
  return;
}

Assistant:

void
mdef_sseq2sen_active(mdef_t * mdef, uint8 * sseq, uint8 * sen)
{
    int32 ss, i;
    s3senid_t *sp;

    for (ss = 0; ss < mdef_n_sseq(mdef); ss++) {
        if (sseq[ss]) {
            sp = mdef->sseq[ss];
            for (i = 0; i < mdef_n_emit_state(mdef); i++)
                sen[sp[i]] = 1;
        }
    }
}